

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laszip_dll.cpp
# Opt level: O0

laszip_I32 laszip_open_writer(laszip_POINTER pointer,laszip_CHAR *file_name,laszip_BOOL compress)

{
  bool bVar1;
  BOOL BVar2;
  int iVar3;
  I32 IVar4;
  laszip_I32 lVar5;
  FILE *pFVar6;
  ByteStreamOutFileLE *this;
  ByteStreamOutFileBE *this_00;
  LASquadtree *this_01;
  LASindex *this_02;
  char *pcVar7;
  ulong local_e0;
  LASquadtree *lasquadtree;
  undefined1 local_80 [8];
  LASzip laszip;
  laszip_dll_struct *laszip_dll;
  laszip_BOOL compress_local;
  laszip_CHAR *file_name_local;
  laszip_POINTER pointer_local;
  
  if (pointer == (laszip_POINTER)0x0) {
    pointer_local._4_4_ = 1;
  }
  else if (file_name == (laszip_CHAR *)0x0) {
    snprintf((char *)((long)pointer + 0x248),0x400,"laszip_CHAR pointer \'file_name\' is zero");
    pointer_local._4_4_ = 1;
  }
  else if (*(long *)((long)pointer + 0x228) == 0) {
    if (*(long *)((long)pointer + 0x238) == 0) {
      pFVar6 = LASfopen(file_name,"wb");
      *(FILE **)((long)pointer + 0x218) = pFVar6;
      if (*(long *)((long)pointer + 0x218) == 0) {
        snprintf((char *)((long)pointer + 0x248),0x400,"cannot open file \'%s\'",file_name);
        pointer_local._4_4_ = 1;
      }
      else {
        iVar3 = setvbuf(*(FILE **)((long)pointer + 0x218),(char *)0x0,0,0x40000);
        if (iVar3 != 0) {
          snprintf((char *)((long)pointer + 0x648),0x400,
                   "setvbuf() failed with buffer size 262144\n");
        }
        BVar2 = IS_LITTLE_ENDIAN();
        if (BVar2) {
          this = (ByteStreamOutFileLE *)operator_new(0x28);
          ByteStreamOutFileLE::ByteStreamOutFileLE(this,*(FILE **)((long)pointer + 0x218));
          *(ByteStreamOutFileLE **)((long)pointer + 0x230) = this;
        }
        else {
          this_00 = (ByteStreamOutFileBE *)operator_new(0x28);
          ByteStreamOutFileBE::ByteStreamOutFileBE(this_00,*(FILE **)((long)pointer + 0x218));
          *(ByteStreamOutFileBE **)((long)pointer + 0x230) = this_00;
        }
        if (*(long *)((long)pointer + 0x230) == 0) {
          snprintf((char *)((long)pointer + 0x248),0x400,"could not alloc ByteStreamOutFile");
          pointer_local._4_4_ = 1;
        }
        else {
          LASzip::LASzip((LASzip *)local_80);
          IVar4 = setup_laszip_items((laszip_dll_struct *)pointer,(LASzip *)local_80,compress);
          if (IVar4 == 0) {
            IVar4 = laszip_prepare_header_for_write((laszip_dll_struct *)pointer);
            if (IVar4 == 0) {
              IVar4 = laszip_prepare_point_for_write((laszip_dll_struct *)pointer,compress);
              if (IVar4 == 0) {
                IVar4 = laszip_prepare_vlrs_for_write((laszip_dll_struct *)pointer);
                if (IVar4 == 0) {
                  IVar4 = laszip_write_header((laszip_dll_struct *)pointer,(LASzip *)local_80,
                                              compress);
                  if (IVar4 == 0) {
                    lVar5 = create_point_writer((laszip_dll_struct *)pointer,(LASzip *)local_80);
                    if (lVar5 == 0) {
                      if ((*(byte *)((long)pointer + 0xa78) & 1) != 0) {
                        this_01 = (LASquadtree *)operator_new(0xa8);
                        LASquadtree::LASquadtree(this_01);
                        LASquadtree::setup(this_01,*(F64 *)((long)pointer + 0xb8),
                                           *(F64 *)((long)pointer + 0xb0),
                                           *(F64 *)((long)pointer + 200),
                                           *(F64 *)((long)pointer + 0xc0),100.0);
                        this_02 = (LASindex *)operator_new(0x30);
                        LASindex::LASindex(this_02);
                        *(LASindex **)((long)pointer + 0xa48) = this_02;
                        LASindex::prepare(*(LASindex **)((long)pointer + 0xa48),this_01,1000);
                        pcVar7 = strdup(file_name);
                        *(char **)((long)pointer + 0xa70) = pcVar7;
                      }
                      if (*(int *)((long)pointer + 0x68) == 0) {
                        local_e0 = *(ulong *)((long)pointer + 0xf8);
                      }
                      else {
                        local_e0 = (ulong)*(uint *)((long)pointer + 0x68);
                      }
                      *(ulong *)((long)pointer + 0x1a8) = local_e0;
                      *(undefined8 *)((long)pointer + 0x1a0) = 0;
                      bVar1 = false;
                    }
                    else {
                      pointer_local._4_4_ = 1;
                      bVar1 = true;
                    }
                  }
                  else {
                    pointer_local._4_4_ = 1;
                    bVar1 = true;
                  }
                }
                else {
                  pointer_local._4_4_ = 1;
                  bVar1 = true;
                }
              }
              else {
                pointer_local._4_4_ = 1;
                bVar1 = true;
              }
            }
            else {
              pointer_local._4_4_ = 1;
              bVar1 = true;
            }
          }
          else {
            pointer_local._4_4_ = 1;
            bVar1 = true;
          }
          LASzip::~LASzip((LASzip *)local_80);
          if (!bVar1) {
            *(undefined1 *)((long)pointer + 0x248) = 0;
            pointer_local._4_4_ = 0;
          }
        }
      }
    }
    else {
      snprintf((char *)((long)pointer + 0x248),0x400,"writer is already open");
      pointer_local._4_4_ = 1;
    }
  }
  else {
    snprintf((char *)((long)pointer + 0x248),0x400,"reader is already open");
    pointer_local._4_4_ = 1;
  }
  return pointer_local._4_4_;
}

Assistant:

LASZIP_API laszip_I32
laszip_open_writer(
    laszip_POINTER                     pointer
    , const laszip_CHAR*               file_name
    , laszip_BOOL                      compress
)
{
  if (pointer == 0) return 1;
  laszip_dll_struct* laszip_dll = (laszip_dll_struct*)pointer;

  try
  {
    if (file_name == 0)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "laszip_CHAR pointer 'file_name' is zero");
      return 1;
    }

    if (laszip_dll->reader)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "reader is already open");
      return 1;
    }

    if (laszip_dll->writer)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "writer is already open");
      return 1;
    }

    // open the file

    laszip_dll->file = LASfopen(file_name, "wb");

    if (laszip_dll->file == 0)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "cannot open file '%s'", file_name);
      return 1;
    }

    if (setvbuf(laszip_dll->file, NULL, _IOFBF, 262144) != 0)
    {
      snprintf(laszip_dll->warning, sizeof(laszip_dll->warning), "setvbuf() failed with buffer size 262144\n");
    }

    // create the outstream

    if (IS_LITTLE_ENDIAN())
      laszip_dll->streamout = new ByteStreamOutFileLE(laszip_dll->file);
    else
      laszip_dll->streamout = new ByteStreamOutFileBE(laszip_dll->file);

    if (laszip_dll->streamout == 0)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "could not alloc ByteStreamOutFile");
      return 1;
    }

    // setup the items that make up the point

    LASzip laszip;
    if (setup_laszip_items(laszip_dll, &laszip, compress))
    {
      return 1;
    }

    // prepare header

    if (laszip_prepare_header_for_write(laszip_dll))
    {
      return 1;
    }

    // prepare point

    if (laszip_prepare_point_for_write(laszip_dll, compress))
    {
      return 1;
    }

    // prepare VLRs

    if (laszip_prepare_vlrs_for_write(laszip_dll))
    {
      return 1;
    }

    // write header variable after variable

    if (laszip_write_header(laszip_dll, &laszip, compress))
    {
      return 1;
    }

    // create the point writer

    if (create_point_writer(laszip_dll, &laszip))
    {
      return 1;
    }

    if (laszip_dll->lax_create)
    {
      // create spatial indexing information using cell_size = 100.0f and threshold = 1000

      LASquadtree* lasquadtree = new LASquadtree;
      lasquadtree->setup(laszip_dll->header.min_x, laszip_dll->header.max_x, laszip_dll->header.min_y, laszip_dll->header.max_y, 100.0f);

      laszip_dll->lax_index = new LASindex;
      laszip_dll->lax_index->prepare(lasquadtree, 1000);

      // copy the file name for later

      laszip_dll->lax_file_name = LASCopyString(file_name);
    }

    // set the point number and point count

    laszip_dll->npoints = (laszip_dll->header.number_of_point_records ? laszip_dll->header.number_of_point_records : laszip_dll->header.extended_number_of_point_records);
    laszip_dll->p_count = 0;
  }
  catch (...)
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "internal error in laszip_open_writer '%s'", file_name);
    return 1;
  }

  laszip_dll->error[0] = '\0';
  return 0;
}